

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O3

CompressionFunction * duckdb::ZSTDFun::GetFunction(PhysicalType data_type)

{
  CompressionFunction *in_RDI;
  
  in_RDI->type = COMPRESSION_ZSTD;
  in_RDI->data_type = data_type;
  in_RDI->init_analyze = ZSTDStorage::StringInitAnalyze;
  in_RDI->analyze = ZSTDStorage::StringAnalyze;
  in_RDI->final_analyze = ZSTDStorage::StringFinalAnalyze;
  in_RDI->init_compression = ZSTDStorage::InitCompression;
  in_RDI->compress = ZSTDStorage::Compress;
  in_RDI->compress_finalize = ZSTDStorage::FinalizeCompress;
  in_RDI->init_prefetch = (compression_init_prefetch_t)0x0;
  in_RDI->init_scan = ZSTDStorage::StringInitScan;
  in_RDI->scan_vector = ZSTDStorage::StringScan;
  in_RDI->scan_partial = ZSTDStorage::StringScanPartial;
  in_RDI->select = (compression_select_t)0x0;
  in_RDI->filter = (compression_filter_t)0x0;
  in_RDI->fetch_row = ZSTDStorage::StringFetchRow;
  in_RDI->skip = ZSTDStorage::StringSkip;
  in_RDI->init_append = (compression_init_append_t)0x0;
  in_RDI->append = (compression_append_t)0x0;
  in_RDI->finalize_append = (compression_finalize_append_t)0x0;
  in_RDI->revert_append = (compression_revert_append_t)0x0;
  in_RDI->serialize_state = (compression_serialize_state_t)0x0;
  in_RDI->deserialize_state = (compression_deserialize_state_t)0x0;
  in_RDI->cleanup_state = (compression_cleanup_state_t)0x0;
  in_RDI->get_segment_info = (compression_get_segment_info_t)0x0;
  in_RDI->validity = REQUIRES_VALIDITY;
  in_RDI->init_segment = ZSTDStorage::StringInitSegment;
  in_RDI->serialize_state = ZSTDStorage::SerializeState;
  in_RDI->deserialize_state = ZSTDStorage::DeserializeState;
  in_RDI->cleanup_state = ZSTDStorage::CleanupState;
  return in_RDI;
}

Assistant:

CompressionFunction ZSTDFun::GetFunction(PhysicalType data_type) {
	D_ASSERT(data_type == PhysicalType::VARCHAR);
	auto zstd = CompressionFunction(
	    CompressionType::COMPRESSION_ZSTD, data_type, ZSTDStorage::StringInitAnalyze, ZSTDStorage::StringAnalyze,
	    ZSTDStorage::StringFinalAnalyze, ZSTDStorage::InitCompression, ZSTDStorage::Compress,
	    ZSTDStorage::FinalizeCompress, ZSTDStorage::StringInitScan, ZSTDStorage::StringScan,
	    ZSTDStorage::StringScanPartial, ZSTDStorage::StringFetchRow, ZSTDStorage::StringSkip);
	zstd.init_segment = ZSTDStorage::StringInitSegment;
	zstd.serialize_state = ZSTDStorage::SerializeState;
	zstd.deserialize_state = ZSTDStorage::DeserializeState;
	zstd.cleanup_state = ZSTDStorage::CleanupState;
	return zstd;
}